

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p_test.cc
# Opt level: O2

int main(void)

{
  time_t tVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar3 = 0;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Running tests... (seed = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,")\n\n");
  iVar4 = 10;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    bVar5 = test_random_instance();
    if (bVar5) {
      std::operator<<((ostream *)&std::cout,"test_random_instance\x1b[1m\x1b[32m PASSED!\x1b[0m\n");
      iVar3 = iVar3 + 1;
    }
    else {
      std::operator<<((ostream *)&std::cout,"test_random_instance\x1b[1m\x1b[31m FAILED!\x1b[0m\n");
    }
  }
  bVar5 = test_simple_instance();
  if (bVar5) {
    std::operator<<((ostream *)&std::cout,"test_simple_instance\x1b[1m\x1b[32m PASSED!\x1b[0m\n");
    iVar3 = iVar3 + 1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"test_simple_instance\x1b[1m\x1b[31m FAILED!\x1b[0m\n");
  }
  bVar5 = test_simple_instance2();
  if (bVar5) {
    std::operator<<((ostream *)&std::cout,"test_simple_instance2\x1b[1m\x1b[32m PASSED!\x1b[0m\n");
    iVar3 = iVar3 + 1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"test_simple_instance2\x1b[1m\x1b[31m FAILED!\x1b[0m\n");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\nDone! Passed ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
  std::operator<<(poVar2," tests.\n");
  return 0;
}

Assistant:

int main() {
    unsigned int seed = (unsigned int)time(0);	
    srand(seed);
    
	std::cout << "Running tests... (seed = " << seed << ")\n\n";

	int passed = 0;
	int num_tests = 0;

    for(int i = 0; i < 10; ++i) {
	    TEST(test_random_instance);
    }

	TEST(test_simple_instance);

    TEST(test_simple_instance2);

	std::cout << "\nDone! Passed " << passed << "/" << num_tests << " tests.\n";
}